

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall r_comp::Compiler::compile(Compiler *this,Ptr *root,bool trace)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  size_t sVar2;
  element_type *peVar3;
  reference psVar4;
  shared_ptr<r_comp::RepliStruct> local_d8;
  shared_ptr<r_comp::RepliStruct> local_c8;
  undefined1 local_b8 [8];
  Ptr view;
  allocator local_81;
  string local_80 [32];
  __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_60;
  shared_ptr<r_comp::RepliStruct> *local_58;
  uint local_4c;
  undefined1 local_48 [8];
  Ptr node;
  __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_30;
  iterator iter;
  bool trace_local;
  Ptr *root_local;
  Compiler *this_local;
  
  this->err = false;
  this->trace = trace;
  iter._M_current._7_1_ = trace;
  sVar2 = r_code::vector<unsigned_int>::size(&(this->_image->object_map).objects);
  this->current_object_index = sVar2;
  peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)root);
  local_30._M_current =
       (shared_ptr<r_comp::RepliStruct> *)
       std::
       vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
       ::begin(&peVar3->args);
  while( true ) {
    peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)root);
    node.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end(&peVar3->args);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                        *)&node.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&local_30);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_48,psVar4);
    peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    if (peVar3->type == Directive) {
      local_4c = 4;
    }
    else {
      local_58 = (shared_ptr<r_comp::RepliStruct> *)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                 ::operator++(&local_30,0);
      peVar3 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)root);
      local_60._M_current =
           (shared_ptr<r_comp::RepliStruct> *)
           std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::end(&peVar3->args);
      bVar1 = __gnu_cxx::operator==(&local_30,&local_60);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"missing view",&local_81);
        this_00 = &view.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)this_00,
                   (shared_ptr<r_comp::RepliStruct> *)local_48);
        set_error(this,(string *)local_80,(Ptr *)this_00);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)
                   &view.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        this_local._7_1_ = 0;
        local_4c = 1;
      }
      else {
        psVar4 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                 ::operator*(&local_30);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)local_b8,psVar4);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  (&local_c8,(shared_ptr<r_comp::RepliStruct> *)local_48);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  (&local_d8,(shared_ptr<r_comp::RepliStruct> *)local_b8);
        bVar1 = read_sys_object(this,&local_c8,&local_d8);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d8);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_c8);
        bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        else {
          this->current_object_index = this->current_object_index + 1;
        }
        local_4c = (uint)bVar1;
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)local_b8);
      }
    }
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_48);
    if ((local_4c != 0) && (local_4c == 1)) goto LAB_001926b8;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&local_30,0);
  }
  this_local._7_1_ = (this->err ^ 0xffU) & 1;
LAB_001926b8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::compile(RepliStruct::Ptr root, bool trace)
{
    this->err = false;
    this->trace = trace;
    current_object_index = _image->object_map.objects.size();

    for (std::vector<RepliStruct::Ptr >::iterator iter = root->args.begin(); iter != root->args.end(); iter++) {
        RepliStruct::Ptr node = *iter;

        if (node->type == RepliStruct::Directive) {
            continue;
        }

        iter++;

        if (iter == root->args.end()) {
            set_error("missing view", node);
            return false;
        }

        RepliStruct::Ptr view = *iter;

        if (!read_sys_object(node, view)) {
            return false;
        }

        current_object_index++;
    }

    return !err;
}